

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t scanner_get_token(scanner_t *scanner,memptr *token,token_type_t *tok_type)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  token_type_t local_40;
  int got_end_quote;
  token_type_t token_type;
  int c;
  char *null_terminator;
  char *cursor;
  token_type_t *tok_type_local;
  memptr *token_local;
  scanner_t *scanner_local;
  
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner",".upnp/src/genlib/net/http/httpparser.c",0xe1,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  if (token == (memptr *)0x0) {
    __assert_fail("token",".upnp/src/genlib/net/http/httpparser.c",0xe2,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  if (tok_type == (token_type_t *)0x0) {
    __assert_fail("tok_type",".upnp/src/genlib/net/http/httpparser.c",0xe3,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  null_terminator = scanner->msg->buf + scanner->cursor;
  pcVar3 = scanner->msg->buf + scanner->msg->length;
  if (null_terminator == pcVar3) {
    scanner_local._4_4_ = PARSE_INCOMPLETE;
  }
  else {
    iVar1 = (int)*null_terminator;
    iVar2 = is_identifier_char(iVar1);
    if (iVar2 == 0) {
      if ((iVar1 == 0x20) || (iVar1 == 9)) {
        token->buf = null_terminator;
        local_40 = TT_WHITESPACE;
        do {
          null_terminator = null_terminator + 1;
          bVar5 = false;
          if ((null_terminator < pcVar3) && (bVar5 = true, *null_terminator != ' ')) {
            bVar5 = *null_terminator == '\t';
          }
        } while (bVar5);
        if ((scanner->entire_msg_loaded == 0) && (null_terminator == pcVar3)) {
          return PARSE_INCOMPLETE;
        }
        token->length = (long)null_terminator - (long)token->buf;
      }
      else if (iVar1 == 0xd) {
        token->buf = null_terminator;
        if (null_terminator + 1 == pcVar3) {
          return PARSE_INCOMPLETE;
        }
        if (null_terminator[1] == '\n') {
          token->length = 2;
          local_40 = TT_CRLF;
        }
        else {
          local_40 = TT_CTRL;
          token->length = 1;
        }
      }
      else if (iVar1 == 10) {
        token->buf = null_terminator;
        token->length = 1;
        local_40 = TT_CRLF;
      }
      else if (iVar1 == 0x22) {
        token->buf = null_terminator;
        local_40 = TT_QUOTEDSTRING;
        bVar5 = false;
        pcVar4 = null_terminator + 1;
        while (null_terminator = pcVar4, null_terminator < pcVar3) {
          pcVar4 = null_terminator + 1;
          iVar1 = (int)*null_terminator;
          if (iVar1 == 0x22) {
            bVar5 = true;
            null_terminator = pcVar4;
            break;
          }
          if (iVar1 == 0x5c) {
            if (pcVar4 < pcVar3) {
              pcVar4 = null_terminator + 2;
            }
          }
          else {
            iVar1 = is_qdtext_char(iVar1);
            if (iVar1 == 0) {
              return PARSE_FAILURE;
            }
          }
        }
        if (!bVar5) {
          if (null_terminator == pcVar3) {
            return PARSE_INCOMPLETE;
          }
          __assert_fail("cursor == null_terminator",".upnp/src/genlib/net/http/httpparser.c",0x131,
                        "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
        }
        token->length = (long)null_terminator - (long)token->buf;
      }
      else {
        iVar2 = is_separator_char(iVar1);
        if (iVar2 == 0) {
          iVar1 = is_control_char(iVar1);
          if (iVar1 == 0) {
            return PARSE_FAILURE;
          }
          token->buf = null_terminator;
          local_40 = TT_CTRL;
          token->length = 1;
        }
        else {
          token->buf = null_terminator;
          local_40 = TT_SEPARATOR;
          token->length = 1;
        }
      }
    }
    else {
      token->buf = null_terminator;
      local_40 = TT_IDENTIFIER;
      do {
        null_terminator = null_terminator + 1;
        bVar5 = false;
        if (null_terminator < pcVar3) {
          iVar1 = is_identifier_char((int)*null_terminator);
          bVar5 = iVar1 != 0;
        }
      } while (bVar5);
      if ((scanner->entire_msg_loaded == 0) && (null_terminator == pcVar3)) {
        return PARSE_INCOMPLETE;
      }
      token->length = (long)null_terminator - (long)token->buf;
    }
    scanner->cursor = token->length + scanner->cursor;
    *tok_type = local_40;
    scanner_local._4_4_ = PARSE_OK;
  }
  return scanner_local._4_4_;
}

Assistant:

static parse_status_t scanner_get_token(
	scanner_t *scanner, memptr *token, token_type_t *tok_type)
{
	char *cursor;
	char *null_terminator; /* point to null-terminator in buffer */
	int c;
	token_type_t token_type;
	int got_end_quote;

	assert(scanner);
	assert(token);
	assert(tok_type);

	/* point to next char in buffer */
	cursor = scanner->msg->buf + scanner->cursor;
	null_terminator = scanner->msg->buf + scanner->msg->length;
	/* not enough chars in input to parse */
	if (cursor == null_terminator)
		return PARSE_INCOMPLETE;
	c = *cursor;
	if (is_identifier_char(c)) {
		/* scan identifier */
		token->buf = cursor++;
		token_type = TT_IDENTIFIER;
		while (cursor < null_terminator && is_identifier_char(*cursor))
			cursor++;
		if (!scanner->entire_msg_loaded && cursor == null_terminator)
			/* possibly more valid chars */
			return PARSE_INCOMPLETE;
		/* calc token length */
		token->length = (size_t)cursor - (size_t)token->buf;
	} else if (c == ' ' || c == '\t') {
		token->buf = cursor++;
		token_type = TT_WHITESPACE;
		while (cursor < null_terminator &&
			(*cursor == ' ' || *cursor == '\t'))
			cursor++;
		if (!scanner->entire_msg_loaded && cursor == null_terminator)
			/* possibly more chars */
			return PARSE_INCOMPLETE;
		token->length = (size_t)cursor - (size_t)token->buf;
	} else if (c == TOKCHAR_CR) {
		/* scan CRLF */
		token->buf = cursor++;
		if (cursor == null_terminator)
			/* not enuf info to determine CRLF */
			return PARSE_INCOMPLETE;
		if (*cursor != TOKCHAR_LF) {
			/* couldn't match CRLF; match as CR */
			token_type = TT_CTRL; /* ctrl char */
			token->length = (size_t)1;
		} else {
			/* got CRLF */
			token->length = (size_t)2;
			token_type = TT_CRLF;
			cursor++;
		}
	} else if (c == TOKCHAR_LF) { /* accept \n as CRLF */
		token->buf = cursor++;
		token->length = (size_t)1;
		token_type = TT_CRLF;
	} else if (c == '"') {
		/* quoted text */
		token->buf = cursor++;
		token_type = TT_QUOTEDSTRING;
		got_end_quote = 0;
		while (cursor < null_terminator) {
			c = *cursor++;
			if (c == '"') {
				got_end_quote = 1;
				break;
			} else if (c == '\\') {
				if (cursor < null_terminator) {
					/* c = *cursor++; */
					cursor++;
					/* the char after '\\' could be ANY
					 * octet */
				}
				/* else, while loop handles incomplete buf */
			} else if (is_qdtext_char(c)) {
				/* just accept char */
			} else
				/* bad quoted text */
				return PARSE_FAILURE;
		}
		if (got_end_quote)
			token->length = (size_t)cursor - (size_t)token->buf;
		else { /* incomplete */

			assert(cursor == null_terminator);
			return PARSE_INCOMPLETE;
		}
	} else if (is_separator_char(c)) {
		/* scan separator */
		token->buf = cursor++;
		token_type = TT_SEPARATOR;
		token->length = (size_t)1;
	} else if (is_control_char(c)) {
		/* scan ctrl char */
		token->buf = cursor++;
		token_type = TT_CTRL;
		token->length = (size_t)1;
	} else
		return PARSE_FAILURE;

	scanner->cursor += token->length; /* move to next token */
	*tok_type = token_type;
	return PARSE_OK;
}